

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O2

bool __thiscall DelaunayMST::isInCircle(DelaunayMST *this,int a,int b,int c,int d)

{
  double dVar1;
  double dVar2;
  Point2d *pPVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Point3d __tmp;
  Point3d local_a8;
  Point3d local_88;
  double local_70;
  Point3d local_68;
  Point3d local_50 [2];
  
  pPVar3 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
           super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
           super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
  local_68.x = pPVar3[a].x;
  local_68.y = pPVar3[a].y;
  local_68.z = local_68.x * local_68.x + local_68.y * local_68.y;
  local_88.x = pPVar3[b].x;
  local_88.y = pPVar3[b].y;
  local_88.z = local_88.x * local_88.x + local_88.y * local_88.y;
  local_a8.x = pPVar3[c].x;
  local_a8.y = pPVar3[c].y;
  local_a8.z = local_a8.x * local_a8.x + local_a8.y * local_a8.y;
  dVar1 = pPVar3[d].x;
  dVar2 = pPVar3[d].y;
  dVar7 = cross<Point2d>(this,pPVar3 + a,pPVar3 + b,pPVar3 + c);
  dVar6 = local_88.z;
  dVar5 = local_88.y;
  dVar4 = local_88.x;
  if (dVar7 < 0.0) {
    local_88.x = local_a8.x;
    local_88.y = local_a8.y;
    local_88.z = local_a8.z;
    local_a8.x = dVar4;
    local_a8.y = dVar5;
    local_a8.z = dVar6;
  }
  local_70 = dVar1 * dVar1 + dVar2 * dVar2;
  cross<DelaunayMST::Point3d>(local_50,this,&local_68,&local_88,&local_a8);
  return (local_70 - local_68.z) * local_50[0].z +
         (dVar1 - local_68.x) * local_50[0].x + (dVar2 - local_68.y) * local_50[0].y < 0.0;
}

Assistant:

bool isInCircle(int a, int b, int c, int d)
	{
		auto mapToHiDim = [](const Point2d &p2)
		{ return Point3d{p2.x, p2.y, p2.x * p2.x + p2.y * p2.y}; };
		Point3d pa = mapToHiDim(p[a]), pb = mapToHiDim(p[b]), pc = mapToHiDim(p[c]), pd = mapToHiDim(p[d]);
		if (cross(p[a], p[b], p[c]) < 0)
			std::swap(pb, pc);
		return Point3d::dot(cross(pa, pb, pc), (pd - pa)) < 0;
	}